

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptRegularExpression.cpp
# Opt level: O3

Var Js::JavascriptRegExp::OP_NewRegEx(RegexPattern *aCompiledRegex,ScriptContext *scriptContext)

{
  Recycler *alloc;
  JavascriptRegExp *this;
  undefined1 local_48 [8];
  TrackAllocData data;
  
  local_48 = (undefined1  [8])&typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_7e873ec;
  data.filename._0_4_ = 0x26d;
  alloc = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_48);
  this = (JavascriptRegExp *)new<Memory::Recycler>(0x40,alloc,0x387914);
  JavascriptRegExp(this,aCompiledRegex,
                   (((scriptContext->super_ScriptContextBase).javascriptLibrary)->regexType).ptr);
  return this;
}

Assistant:

Var JavascriptRegExp::OP_NewRegEx(UnifiedRegex::RegexPattern* aCompiledRegex, ScriptContext* scriptContext)
    {
        JavascriptRegExp * pNewInstance =
            RecyclerNew(scriptContext->GetRecycler(), JavascriptRegExp, aCompiledRegex,
            scriptContext->GetLibrary()->GetRegexType());
        return pNewInstance;
    }